

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.cpp
# Opt level: O0

void __thiscall
mjs::anon_unknown_46::json_lexer::throw_unexpected(json_lexer *this,json_token *token)

{
  json_token_type jVar1;
  wostream *pwVar2;
  size_t sVar3;
  native_error_exception *this_00;
  gc_heap_ptr<mjs::global_object> *this_01;
  global_object *this_02;
  wstring local_200 [32];
  wstring_view local_1e0;
  wstring local_1d0;
  wstring_view local_1b0 [2];
  wostringstream local_190 [8];
  wostringstream woss;
  json_token *token_local;
  json_lexer *this_local;
  
  std::__cxx11::wostringstream::wostringstream(local_190);
  std::operator<<((wostream *)local_190,"Unexpected ");
  jVar1 = json_token::type(token);
  if (jVar1 == eof) {
    std::operator<<((wostream *)local_190,"end of input");
  }
  else {
    pwVar2 = std::operator<<((wostream *)local_190,"token ");
    pwVar2 = anon_unknown_46::operator<<(pwVar2,token);
    std::operator<<(pwVar2," in JSON");
  }
  pwVar2 = std::operator<<((wostream *)local_190," at position ");
  sVar3 = json_token::pos(token);
  std::wostream::operator<<(pwVar2,sVar3);
  this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
  this_01 = global(this);
  this_02 = gc_heap_ptr<mjs::global_object>::operator->(this_01);
  global_object::stack_trace_abi_cxx11_(&local_1d0,this_02);
  local_1b0[0] = (wstring_view)
                 std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_1d0);
  std::__cxx11::wostringstream::str();
  local_1e0 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_200);
  native_error_exception::native_error_exception(this_00,syntax,local_1b0,&local_1e0);
  __cxa_throw(this_00,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

[[noreturn]] void throw_unexpected(const json_token& token) {
        std::wostringstream woss;
        woss << "Unexpected ";
        if (token.type() == json_token_type::eof) {
            woss << "end of input";
        } else {
            woss << "token " << token << " in JSON";
        }
        woss << " at position " << token.pos();
        throw native_error_exception{native_error_type::syntax, global()->stack_trace(), woss.str()};
    }